

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O0

int uv__statx(int dirfd,char *path,int flags,uint mask,uv__statx *statxbuf)

{
  long lVar1;
  int rc;
  uv__statx *statxbuf_local;
  uint mask_local;
  int flags_local;
  char *path_local;
  int dirfd_local;
  
  lVar1 = syscall(0x14c,(ulong)(uint)dirfd,path,(ulong)(uint)flags,(ulong)mask,statxbuf);
  return (int)lVar1;
}

Assistant:

int uv__statx(int dirfd,
              const char* path,
              int flags,
              unsigned int mask,
              struct uv__statx* statxbuf) {
#if !defined(__NR_statx) || defined(__ANDROID_API__) && __ANDROID_API__ < 30
  return errno = ENOSYS, -1;
#else
  int rc;

  rc = syscall(__NR_statx, dirfd, path, flags, mask, statxbuf);
  if (rc >= 0)
    uv__msan_unpoison(statxbuf, sizeof(*statxbuf));

  return rc;
#endif
}